

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmersenne.h
# Opt level: O2

void __thiscall CVmMT19937::seed(CVmMT19937 *this,uint32_t s)

{
  int iVar1;
  bool bVar2;
  
  base_seed(this,s);
  iVar1 = 0x25;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    rand(this);
  }
  return;
}

Assistant:

void seed(uint32_t s)
    {
        /* do a pass through the mt array with LCG values from the seed */
        base_seed(s);

        /* 
         *   discard a few initial values to prime the pump - the MT
         *   algorithm is considered slow at getting started (i.e., it needs
         *   to run through a few iterations before it starts generating good
         *   numbers)
         */
        for (int i = 0 ; i < 37 ; ++i)
            rand();
    }